

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O3

Color * LoadImageColors(Image image)

{
  uchar uVar1;
  ushort uVar2;
  Color *pCVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  long in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000014;
  int in_stack_0000001c;
  
  if (in_stack_00000014 == 0 || in_stack_00000010 == 0) {
    pCVar3 = (Color *)0x0;
  }
  else {
    uVar5 = in_stack_00000014 * in_stack_00000010;
    pCVar3 = (Color *)malloc((long)(int)uVar5 << 2);
    if (in_stack_0000001c < 0xb) {
      if (in_stack_0000001c - 8U < 3) {
        TraceLog(4,"IMAGE: Pixel format converted from 32bit to 8bit per channel");
      }
      if (0 < (int)uVar5) {
        uVar4 = 0;
        iVar6 = 0;
        do {
          switch(in_stack_0000001c) {
          case 1:
            uVar1 = *(uchar *)(in_stack_00000008 + uVar4);
            pCVar3[uVar4].r = uVar1;
            pCVar3[uVar4].g = uVar1;
            pCVar3[uVar4].b = uVar1;
            goto LAB_0013a3c6;
          case 2:
            uVar1 = *(uchar *)(in_stack_00000008 + iVar6);
            pCVar3[uVar4].r = uVar1;
            pCVar3[uVar4].g = uVar1;
            pCVar3[uVar4].b = uVar1;
            pCVar3[uVar4].a = *(uchar *)(in_stack_00000008 + 1 + (long)iVar6);
            iVar6 = iVar6 + 2;
            break;
          case 3:
            uVar2 = *(ushort *)(in_stack_00000008 + uVar4 * 2);
            pCVar3[uVar4].r = (byte)(uVar2 >> 8) & 0xf8;
            pCVar3[uVar4].g = (byte)(uVar2 >> 3) & 0xfc;
            pCVar3[uVar4].b = (char)uVar2 << 3;
            goto LAB_0013a3c6;
          case 4:
            lVar7 = (long)iVar6;
            pCVar3[uVar4].r = *(uchar *)(in_stack_00000008 + lVar7);
            pCVar3[uVar4].g = *(uchar *)(in_stack_00000008 + 1 + lVar7);
            pCVar3[uVar4].b = *(uchar *)(in_stack_00000008 + 2 + lVar7);
            goto LAB_0013a49e;
          case 5:
            uVar2 = *(ushort *)(in_stack_00000008 + uVar4 * 2);
            pCVar3[uVar4].r = (byte)(uVar2 >> 8) & 0xf8;
            pCVar3[uVar4].g = (byte)(uVar2 >> 3) & 0xf8;
            pCVar3[uVar4].b = (byte)uVar2 * '\x04' & 0xf8;
            pCVar3[uVar4].a = -((byte)uVar2 & 1);
            break;
          case 6:
            uVar2 = *(ushort *)(in_stack_00000008 + uVar4 * 2);
            uVar8 = (uint)((byte)uVar2 & 0xf) << 0x18 |
                    (uint)(byte)((byte)uVar2 >> 4) << 0x10 | uVar2 & 0xf00 | (uint)(uVar2 >> 0xc);
            auVar9 = psllw(ZEXT416(uVar8),4);
            pCVar3[uVar4] = (Color)(auVar9._0_4_ & 0xf0f0f0f0 | uVar8);
            break;
          case 7:
            pCVar3[uVar4] = *(Color *)(in_stack_00000008 + iVar6);
            iVar6 = iVar6 + 4;
            break;
          case 8:
            pCVar3[uVar4].r = (uchar)(int)(*(float *)(in_stack_00000008 + (long)iVar6 * 4) * 255.0);
            pCVar3[uVar4].g = '\0';
            pCVar3[uVar4].b = '\0';
LAB_0013a3c6:
            pCVar3[uVar4].a = 0xff;
            break;
          case 9:
            lVar7 = (long)iVar6;
            pCVar3[uVar4].r = (uchar)(int)(*(float *)(in_stack_00000008 + lVar7 * 4) * 255.0);
            pCVar3[uVar4].g = (uchar)(int)(*(float *)(in_stack_00000008 + 4 + lVar7 * 4) * 255.0);
            pCVar3[uVar4].b = (uchar)(int)(*(float *)(in_stack_00000008 + 8 + lVar7 * 4) * 255.0);
LAB_0013a49e:
            pCVar3[uVar4].a = 0xff;
            iVar6 = iVar6 + 3;
            break;
          case 10:
            lVar7 = (long)iVar6;
            iVar6 = iVar6 + 4;
            pCVar3[uVar4] =
                 (Color)(((int)(*(float *)(in_stack_00000008 + lVar7 * 4) * 255.0) & 0xffU) *
                        0x1010101);
          }
          uVar4 = uVar4 + 1;
        } while (uVar5 != uVar4);
      }
    }
    else {
      TraceLog(4,"IMAGE: Pixel data retrieval not supported for compressed image formats");
    }
  }
  return pCVar3;
}

Assistant:

Color *LoadImageColors(Image image)
{
    if ((image.width == 0) || (image.height == 0)) return NULL;

    Color *pixels = (Color *)RL_MALLOC(image.width*image.height*sizeof(Color));

    if (image.format >= PIXELFORMAT_COMPRESSED_DXT1_RGB) TRACELOG(LOG_WARNING, "IMAGE: Pixel data retrieval not supported for compressed image formats");
    else
    {
        if ((image.format == PIXELFORMAT_UNCOMPRESSED_R32) ||
            (image.format == PIXELFORMAT_UNCOMPRESSED_R32G32B32) ||
            (image.format == PIXELFORMAT_UNCOMPRESSED_R32G32B32A32)) TRACELOG(LOG_WARNING, "IMAGE: Pixel format converted from 32bit to 8bit per channel");

        for (int i = 0, k = 0; i < image.width*image.height; i++)
        {
            switch (image.format)
            {
                case PIXELFORMAT_UNCOMPRESSED_GRAYSCALE:
                {
                    pixels[i].r = ((unsigned char *)image.data)[i];
                    pixels[i].g = ((unsigned char *)image.data)[i];
                    pixels[i].b = ((unsigned char *)image.data)[i];
                    pixels[i].a = 255;

                } break;
                case PIXELFORMAT_UNCOMPRESSED_GRAY_ALPHA:
                {
                    pixels[i].r = ((unsigned char *)image.data)[k];
                    pixels[i].g = ((unsigned char *)image.data)[k];
                    pixels[i].b = ((unsigned char *)image.data)[k];
                    pixels[i].a = ((unsigned char *)image.data)[k + 1];

                    k += 2;
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R5G5B5A1:
                {
                    unsigned short pixel = ((unsigned short *)image.data)[i];

                    pixels[i].r = (unsigned char)((float)((pixel & 0b1111100000000000) >> 11)*(255/31));
                    pixels[i].g = (unsigned char)((float)((pixel & 0b0000011111000000) >> 6)*(255/31));
                    pixels[i].b = (unsigned char)((float)((pixel & 0b0000000000111110) >> 1)*(255/31));
                    pixels[i].a = (unsigned char)((pixel & 0b0000000000000001)*255);

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R5G6B5:
                {
                    unsigned short pixel = ((unsigned short *)image.data)[i];

                    pixels[i].r = (unsigned char)((float)((pixel & 0b1111100000000000) >> 11)*(255/31));
                    pixels[i].g = (unsigned char)((float)((pixel & 0b0000011111100000) >> 5)*(255/63));
                    pixels[i].b = (unsigned char)((float)(pixel & 0b0000000000011111)*(255/31));
                    pixels[i].a = 255;

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R4G4B4A4:
                {
                    unsigned short pixel = ((unsigned short *)image.data)[i];

                    pixels[i].r = (unsigned char)((float)((pixel & 0b1111000000000000) >> 12)*(255/15));
                    pixels[i].g = (unsigned char)((float)((pixel & 0b0000111100000000) >> 8)*(255/15));
                    pixels[i].b = (unsigned char)((float)((pixel & 0b0000000011110000) >> 4)*(255/15));
                    pixels[i].a = (unsigned char)((float)(pixel & 0b0000000000001111)*(255/15));

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R8G8B8A8:
                {
                    pixels[i].r = ((unsigned char *)image.data)[k];
                    pixels[i].g = ((unsigned char *)image.data)[k + 1];
                    pixels[i].b = ((unsigned char *)image.data)[k + 2];
                    pixels[i].a = ((unsigned char *)image.data)[k + 3];

                    k += 4;
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R8G8B8:
                {
                    pixels[i].r = (unsigned char)((unsigned char *)image.data)[k];
                    pixels[i].g = (unsigned char)((unsigned char *)image.data)[k + 1];
                    pixels[i].b = (unsigned char)((unsigned char *)image.data)[k + 2];
                    pixels[i].a = 255;

                    k += 3;
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R32:
                {
                    pixels[i].r = (unsigned char)(((float *)image.data)[k]*255.0f);
                    pixels[i].g = 0;
                    pixels[i].b = 0;
                    pixels[i].a = 255;

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R32G32B32:
                {
                    pixels[i].r = (unsigned char)(((float *)image.data)[k]*255.0f);
                    pixels[i].g = (unsigned char)(((float *)image.data)[k + 1]*255.0f);
                    pixels[i].b = (unsigned char)(((float *)image.data)[k + 2]*255.0f);
                    pixels[i].a = 255;

                    k += 3;
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R32G32B32A32:
                {
                    pixels[i].r = (unsigned char)(((float *)image.data)[k]*255.0f);
                    pixels[i].g = (unsigned char)(((float *)image.data)[k]*255.0f);
                    pixels[i].b = (unsigned char)(((float *)image.data)[k]*255.0f);
                    pixels[i].a = (unsigned char)(((float *)image.data)[k]*255.0f);

                    k += 4;
                } break;
                default: break;
            }
        }
    }

    return pixels;
}